

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void lj_record_ins(jit_State *J)

{
  IROp1 *pIVar1;
  SnapEntry *pSVar2;
  byte bVar3;
  IROp *pc;
  GCproto *pt;
  GCproto *pGVar4;
  TValue *pTVar5;
  SnapShot *pSVar6;
  TValue TVar7;
  IRRef1 IVar8;
  ushort uVar9;
  BCLine BVar10;
  uint uVar11;
  int iVar12;
  TRef TVar13;
  uint uVar14;
  LoopEvent LVar15;
  IROp IVar16;
  MMS MVar17;
  TRef *pTVar18;
  ulong uVar19;
  IROp IVar20;
  BCIns *pc_00;
  ushort uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ushort uVar25;
  ulong uVar26;
  TValue *o;
  IROp IVar27;
  TValue local_80;
  TValue local_78;
  TValue local_70 [4];
  uint local_50;
  uint local_4c;
  uint local_48;
  undefined4 local_3c;
  uint local_34;
  uint rbase;
  
  if (J->postproc != LJ_POST_NONE) {
    switch(J->postproc) {
    case LJ_POST_FIXCOMP:
      uVar23._0_2_ = J[-1].penalty[0x3f].val;
      uVar23._2_2_ = J[-1].penalty[0x3f].reason;
      rec_comp_fixup(J,*(BCIns **)&J[-1].penaltyslot,
                     **(BCIns **)&J[-1].penaltyslot & 1 ^ (uint)(0xfffffffd < uVar23));
    case LJ_POST_FIXGUARD:
    case LJ_POST_FIXGUARDSNAP:
      uVar11._0_2_ = J[-1].penalty[0x3f].val;
      uVar11._2_2_ = J[-1].penalty[0x3f].reason;
      if ((0xfffffffd < uVar11) &&
         (pIVar1 = &(J->fold).ins.field_1.o, *pIVar1 = *pIVar1 ^ 1,
         J->postproc == LJ_POST_FIXGUARDSNAP)) {
        uVar24 = (ulong)(J->cur).nsnap;
        pSVar6 = (J->cur).snap;
        pSVar2 = (J->cur).snapmap +
                 (((uint)pSVar6[uVar24 - 1].nent + pSVar6[uVar24 - 1].mapofs) - 1);
        *pSVar2 = *pSVar2 - 1;
      }
      lj_opt_fold(J);
    case LJ_POST_FIXBOOL:
      uVar14._0_2_ = J[-1].penalty[0x3f].val;
      uVar14._2_2_ = J[-1].penalty[0x3f].reason;
      if ((0xfffffffd < uVar14) && ((ulong)J->maxslot != 0)) {
        uVar24 = 0;
        do {
          if ((J->base[uVar24] == 0x2007ffd) && (*(int *)((long)J->L->base + uVar24 * 8 + 4) == -2))
          {
            J->base[uVar24] = 0x1007ffe;
            break;
          }
          uVar24 = uVar24 + 1;
        } while (J->maxslot != uVar24);
      }
      break;
    case LJ_POST_FIXCONST:
      uVar23 = J->maxslot;
      if (uVar23 != 0) {
        pTVar5 = J->L->base;
        pTVar18 = J->base;
        uVar24 = 0;
        o = pTVar5;
        do {
          if ((pTVar18[uVar24] == 0x7fff) && (*(int *)((long)pTVar5 + uVar24 * 8 + 4) != -1)) {
            TVar13 = lj_record_constify(J,o);
            pTVar18 = J->base;
            pTVar18[uVar24] = TVar13;
            uVar23 = J->maxslot;
          }
          uVar24 = uVar24 + 1;
          o = o + 1;
        } while (uVar24 < uVar23);
      }
      break;
    case LJ_POST_FFRETRY:
      if (0x60 < (byte)*J->pc) {
        return;
      }
    }
    J->postproc = LJ_POST_NONE;
  }
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc - *(int *)&J->bc_min))) {
    lj_trace_err(J,LJ_TRERR_LLEAVE);
  }
  if ((J->prof_mode != 0) && (pt = J->pt, pt != (GCproto *)0x0)) {
    pGVar4 = J->prev_pt;
    J->prev_pt = pt;
    if (pGVar4 == (GCproto *)0x0 || pGVar4 == pt) {
      if (J->prof_mode == 0x6c) {
        BVar10 = lj_debug_line(pt,(BCPos)((ulong)((long)pc + (-0x40 - (long)pt)) >> 2));
        iVar12 = J->prev_line;
        J->prev_line = BVar10;
        if (iVar12 != BVar10) goto LAB_0014f0e6;
      }
    }
    else {
      J->prev_line = -1;
LAB_0014f0e6:
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      lj_snap_add(J);
    }
  }
  pTVar5 = J->L->base;
  IVar27 = *pc;
  IVar16 = IVar27 & 0xff;
  uVar23 = IVar27 >> 8 & 0xff;
  uVar19 = (ulong)uVar23;
  local_48 = 0;
  uVar9 = lj_bc_mode[IVar16];
  local_34 = uVar9 & 7;
  uVar24 = uVar19;
  if ((short)local_34 == 3) {
    local_70[0] = pTVar5[uVar19];
    uVar11 = J->base[uVar19];
    if (J->base[uVar19] == 0) {
      uVar11 = sload(J,uVar23);
    }
    local_48 = uVar11;
    uVar24 = (ulong)local_48;
  }
  uVar26 = (ulong)(IVar27 >> 0x18);
  uVar22 = (ulong)(IVar27 >> 0x10 & 0xff);
  if ((uVar9 >> 3 & 0xf) == 3) {
    local_80 = pTVar5[uVar26];
    local_50 = J->base[uVar26];
    if (local_50 == 0) {
      local_50 = sload(J,IVar27 >> 0x18);
    }
    uVar26 = (ulong)local_50;
  }
  else if ((uVar9 >> 3 & 0xf) == 0) {
    uVar26 = 0;
    uVar22 = (ulong)(IVar27 >> 0x10);
  }
  uVar23 = (uint)uVar22;
  switch(uVar9 >> 7 & 0xf) {
  case 3:
    local_78 = (TValue)*(TValue *)&pTVar5[uVar22].field_2;
    local_4c = J->base[uVar22];
    if (local_4c == 0) {
      local_4c = sload(J,uVar23);
    }
    break;
  default:
    goto switchD_0014f22f_caseD_4;
  case 8:
    local_78.field_2.it = ~uVar23;
    local_4c = uVar23 * 0xffffff + 0x7fff;
    break;
  case 9:
    local_78 = (TValue)*(TValue *)&((TValue *)((ulong)(J->pt->k).ptr32 + uVar22 * 8))->field_2;
    local_4c = lj_ir_knumint(J,local_78.n);
    break;
  case 10:
    local_78.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         ((anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
         ((ulong)(J->pt->k).ptr32 + (long)(int)~uVar23 * 4))->i;
    local_78.field_2.it = 0xfffffffb;
    local_4c = lj_ir_kgc(J,(GCobj *)(ulong)local_78.u32.lo,IRT_STR);
  }
  uVar22 = (ulong)local_4c;
switchD_0014f22f_caseD_4:
  TVar7 = local_80;
  uVar21 = (ushort)uVar22;
  uVar14 = (uint)uVar22;
  uVar11 = (uint)uVar26;
  uVar23 = (uint)(uVar22 >> 0x18);
  uVar25 = (ushort)uVar24;
  rbase = (uint)uVar24;
  switch(IVar27 & 0xff) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if (((rbase & 0x1f000000) == 0xa000000) || ((uVar14 & 0x1f000000) == 0xa000000)) {
      MVar17 = MM_le - ((IVar27 & IR_LE) == IR_LT);
LAB_0014f4c1:
      rec_mm_comp_cdata(J,(RecordIndex *)&local_80.field_2,IVar16,MVar17);
    }
    else {
      uVar11 = (uint)(uVar24 >> 0x18);
      if ((((short)(uVar21 | uVar25) < 0) ||
          (((rbase & 0x1f000000) != 0x4000000 && (5 < (uVar11 & 0x1e) - 0xe)))) ||
         (((uVar14 & 0x1f000000) != 0x4000000 && (5 < (uVar23 & 0x1e) - 0xe)))) {
        uVar11 = uVar11 & 0x1f;
        uVar14 = uVar11;
        if (uVar11 - 0xf < 5) {
          uVar14 = 0x13;
        }
        uVar23 = uVar23 & 0x1f;
        if (uVar23 - 0xf < 5) {
          uVar23 = 0x13;
        }
        if (uVar14 == uVar23) {
LAB_0014f92d:
          rec_comp_prep(J);
          if (uVar14 == 4) {
            iVar12 = lj_ir_strcmp((GCstr *)(local_70[0].u64 & 0xffffffff),
                                  (GCstr *)(local_78.u64 & 0xffffffff),IVar16);
            TVar13 = lj_ir_call(J,IRCALL_lj_str_cmp,uVar24,uVar22);
            uVar24 = (ulong)TVar13;
            TVar13 = lj_ir_kint(J,0);
            uVar22 = (ulong)TVar13;
          }
          else {
            if (uVar14 != 0x13) {
              if (uVar14 != 0xe) {
                rec_mm_comp(J,(RecordIndex *)&local_80.field_2,IVar16);
                break;
              }
              goto LAB_0014febe;
            }
            iVar12 = lj_ir_numcmp(local_70[0].n,local_78.n,IVar16);
          }
          IVar20 = iVar12 == 0 ^ IVar16;
          uVar9 = 0x93;
        }
        else {
          if ((uVar14 == 0x13) && (uVar23 == 0xe)) {
            (J->fold).ins.field_0.op1 = uVar25;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
            TVar13 = lj_opt_fold(J);
            uVar24 = (ulong)TVar13;
          }
          else {
            if ((uVar14 != 0xe) || (uVar23 != 0x13)) {
              if ((1 < uVar14 - 1) || (uVar14 = uVar11, 1 < uVar23 - 1)) break;
              goto LAB_0014f92d;
            }
            (J->fold).ins.field_0.op1 = uVar21;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
            TVar13 = lj_opt_fold(J);
            uVar22 = (ulong)TVar13;
          }
          rec_comp_prep(J);
LAB_0014febe:
          IVar16 = IVar27 * 4 & IR_ULT ^ IVar16;
          iVar12 = lj_ir_numcmp(local_70[0].n,local_78.n,IVar16);
          IVar20 = IVar16 ^ IR_UGE;
          if (iVar12 != 0) {
            IVar20 = IVar16;
          }
          uVar9 = 0x8e;
        }
        (J->fold).ins.field_0.ot = (ushort)(IVar20 << 8) | uVar9;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar24;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar22;
        lj_opt_fold(J);
        pc_00 = J->pc;
        IVar27 = IVar27 ^ IVar20;
LAB_0014ff9a:
        rec_comp_fixup(J,pc_00,IVar27 & IR_GE);
      }
    }
    break;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    uVar23 = rbase & 0x1f000000;
    if ((uVar23 == 0xa000000) || ((uVar14 & 0x1f000000) == 0xa000000)) {
      MVar17 = MM_eq;
      goto LAB_0014f4c1;
    }
    if ((((short)(uVar21 | uVar25) < 0) || (uVar23 == 0xc000000)) || (uVar23 == 0xb000000)) {
      rec_comp_prep(J);
      iVar12 = lj_record_objcmp(J,rbase,uVar14,local_70,&local_78);
      if ((iVar12 == 2) || ((uVar23 != 0xb000000 && (uVar23 != 0xc000000)))) {
        pc_00 = J->pc;
        IVar27 = (IROp)(byte)(iVar12 != 0 ^ (byte)IVar27);
        goto LAB_0014ff9a;
      }
      if (iVar12 == 1) {
        rec_mm_equal(J,(RecordIndex *)&local_80.field_2,IVar16);
      }
    }
    break;
  case IR_NOP:
  case IR_BASE:
    if ((((uVar22 & 0x1e000000) == 0 ^ (byte)IVar27) & 1) != 0) {
      uVar22 = 0;
    }
  case IR_PVAL:
  case IR_GCSTEP:
    uVar14 = (uint)*(byte *)((long)pc + 5);
    if ((uint)*(byte *)((long)pc + 5) < J->maxslot) {
LAB_0014f599:
      J->maxslot = uVar14;
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (uVar14 == 5) {
      uVar23 = lj_ir_tostr(J,rbase);
LAB_0014fdf9:
      uVar24 = (ulong)uVar23;
    }
    else if (uVar14 == 0xf) {
      uVar23 = lj_ir_tonum(J,rbase);
      goto LAB_0014fdf9;
    }
    J->base[uVar19] = (TRef)uVar24;
    break;
  case IR_USE:
    if (J->maxslot < rbase) {
      J->base[rbase - 1] = 0;
    }
    break;
  case IR_PHI:
    uVar19 = uVar22 & 0x1e000000;
    uVar22 = 0x1007ffe;
    if (uVar19 == 0) {
      uVar22 = 0x2007ffd;
    }
    goto switchD_0014f2e6_caseD_27;
  case IR_RENAME:
    if ((uVar14 & 0x1f000000) == 0x4000000 || (uVar23 & 0x1e) - 0xe < 6) {
      uVar23 = lj_opt_narrow_unm(J,uVar14,&local_78);
      goto LAB_0014f66b;
    }
    local_80.u64 = local_78.u64;
    MVar17 = MM_unm;
    local_50 = uVar14;
    goto LAB_0014f622;
  case IR_PROF:
    if ((uVar14 & 0x1f000000) == 0xb000000) {
      uVar23 = lj_ir_call(J,IRCALL_lj_tab_len,uVar22);
      goto LAB_0014f66b;
    }
    if ((uVar14 & 0x1f000000) != 0x4000000) {
      rec_mm_len(J,uVar14,&local_78);
      goto LAB_0014fda1;
    }
    (J->fold).ins.field_0.op1 = uVar21;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
    uVar23 = lj_opt_fold(J);
    goto LAB_0014fb06;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    uVar19 = uVar22;
    uVar22 = uVar26;
    goto LAB_0014f3cc;
  case IR_KKPTR:
  case IR_BSHL:
    uVar22 = uVar26;
    uVar11 = uVar14;
LAB_0014f5aa:
    if (((((uint)uVar22 & 0x1f000000) == 0x4000000) || (((uint)(uVar22 >> 0x18) & 0x1e) - 0xe < 6))
       && ((uVar11 & 0x1f000000) == 0x4000000 || (uVar11 >> 0x18 & 0x1e) - 0xe < 6)) {
      uVar23 = lj_opt_narrow_mod(J,(uint)uVar22,uVar11,&local_80,&local_78);
      goto LAB_0014fb06;
    }
    MVar17 = MM_mod;
LAB_0014f622:
    rec_mm_arith(J,(RecordIndex *)&local_80.field_2,MVar17);
    goto LAB_0014fda1;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    local_70[0] = local_80;
    local_80.u64 = local_78.u64;
    local_78 = TVar7;
    uVar19 = uVar26;
    local_50 = uVar14;
    local_4c = uVar11;
    if (IVar16 == IR_BNOT) goto LAB_0014f5aa;
LAB_0014f3cc:
    if (((((uint)uVar22 & 0x1f000000) != 0x4000000) && (5 < ((uint)(uVar22 >> 0x18) & 0x1e) - 0xe))
       || (((TRef)uVar19 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar19 >> 0x18) & 0x1e) - 0xe)) {
      MVar17 = (MMS)(uVar9 >> 0xb);
      goto LAB_0014f622;
    }
    uVar23 = lj_opt_narrow_arith(J,(uint)uVar22,(TRef)uVar19,&local_80,&local_78,
                                 (uVar9 >> 0xb) + IR_BNOT);
LAB_0014fb06:
    uVar22 = (ulong)uVar23;
    break;
  case IR_BSHR:
    if (((uVar11 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar26 >> 0x18) & 0x1e) - 0xe) ||
       ((uVar14 & 0x1f000000) != 0x4000000 && 5 < (uVar23 & 0x1e) - 0xe)) {
      MVar17 = MM_pow;
      goto LAB_0014f622;
    }
    uVar23 = lj_opt_narrow_arith(J,uVar11,uVar14,&local_80,&local_78,IR_POW);
    goto LAB_0014f66b;
  case IR_BSAR:
    TVar13 = rec_cat(J,uVar11,uVar14);
    uVar22 = (ulong)TVar13;
    if (0xfffffeff < TVar13) {
      lj_err_throw(J->L,-TVar13);
    }
    break;
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
  case IR_CALLA:
    goto switchD_0014f2e6_caseD_27;
  case IR_BROR:
    uVar23 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~uVar22 * 4),IRT_CDATA)
    ;
    goto LAB_0014f66b;
  case IR_ADD:
    uVar23 = lj_ir_kint(J,(int)(short)uVar21);
    goto LAB_0014f66b;
  case IR_DIV:
    if (rbase <= uVar14) {
      pTVar18 = J->base;
      uVar19 = uVar24;
      do {
        uVar23 = (int)uVar19 + 1;
        uVar24 = (ulong)uVar23;
        pTVar18[uVar19] = 0x7fff;
        uVar19 = uVar24;
      } while (uVar23 <= uVar14);
    }
    if (uVar14 < J->maxslot) break;
    uVar14 = uVar14 + 1;
    goto LAB_0014f599;
  case IR_MOD:
    uVar23 = rec_upvalue(J,uVar14,0);
    goto LAB_0014f66b;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue(J,rbase,uVar14);
    break;
  case IR_MIN:
  case IR_MAX:
  case IR_SLOAD:
  case IR_ASTORE:
switchD_0014f2e6_caseD_32:
    (J->errinfo).n = (double)IVar16;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  case IR_FPMATH:
    IVar8 = 0x801;
    if ((uVar14 & 0x7ff) != 0x7ff) {
      IVar8 = (IRRef1)(uVar14 & 0x7ff);
    }
    (J->fold).ins.field_0.ot = 0x4f8b;
    (J->fold).ins.field_0.op1 = IVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)(uVar14 >> 0xb);
    goto LAB_0014f9b9;
  case IR_ADDOV:
    TVar13 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~uVar22 * 4),IRT_TAB);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x508b0000;
LAB_0014f9b9:
    uVar23 = lj_opt_fold(J);
    goto LAB_0014f66b;
  case IR_SUBOV:
  case IR_MULOV:
    local_80.field_2.it = 0xfffffff4;
    local_80.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(J->fn->c).env.gcptr32
    ;
    TVar13 = getcurrf(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar13;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x440b0001;
    local_50 = lj_opt_fold(J);
    local_3c = 100;
    goto LAB_0014f666;
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    goto switchD_0014f2e6_caseD_38;
  case IR_HREF:
  case IR_FREF:
    local_78.n = (lua_Number)(int)uVar14;
    local_4c = lj_ir_kint(J,uVar14);
    goto switchD_0014f2e6_caseD_38;
  case IR_NEWREF:
  case IR_LREF:
    local_3c = 0;
LAB_0014f666:
    uVar23 = lj_record_idx(J,(RecordIndex *)&local_80.field_2);
LAB_0014f66b:
    uVar22 = (ulong)uVar23;
    goto switchD_0014f2e6_caseD_27;
  case IR_STRREF:
    rec_tsetm(J,rbase,(BCReg)((ulong)((long)J->L->top - (long)J->L->base) >> 3),local_78._0_4_);
LAB_0014fbd0:
    J->maxslot = rbase;
    break;
  case IR_ALOAD:
    uVar22 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase);
    goto LAB_0014fb8e;
  case IR_HLOAD:
    goto LAB_0014fb8e;
  case IR_ULOAD:
    uVar22 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase);
    goto LAB_0014fbe0;
  case IR_FLOAD:
LAB_0014fbe0:
    lj_record_tailcall(J,rbase,uVar22 - 1);
    break;
  case IR_XLOAD:
    pTVar18 = J->base;
    TVar13 = pTVar18[rbase - 3];
    if (TVar13 == 0) {
      TVar13 = sload(J,rbase - 3);
      pTVar18 = J->base;
    }
    pTVar18[uVar24] = TVar13;
    TVar13 = pTVar18[rbase - 2];
    if (TVar13 == 0) {
      TVar13 = sload(J,rbase - 2);
      pTVar18 = J->base;
    }
    pTVar18[rbase + 1] = TVar13;
    TVar13 = pTVar18[rbase - 1];
    if (TVar13 == 0) {
      TVar13 = sload(J,rbase - 1);
      pTVar18 = J->base;
    }
    pTVar18[rbase + 2] = TVar13;
    pTVar5 = J->L->base;
    TVar7 = (pTVar5 + (uVar24 - 3))[1];
    pTVar5[uVar24] = pTVar5[uVar24 - 3];
    (pTVar5 + uVar24)[1] = TVar7;
    pTVar5[uVar24 + 2] = pTVar5[uVar24 - 1];
LAB_0014fb8e:
    lj_record_call(J,rbase,uVar22 - 1);
    break;
  case IR_VLOAD:
    rec_varg(J,rbase,uVar26 - 1);
    break;
  case IR_HSTORE:
    uVar22 = (ulong)(((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - rbase) + 1);
    goto LAB_0014f71b;
  case IR_USTORE:
  case IR_FSTORE:
  case IR_XSTORE:
LAB_0014f71b:
    if (J->prof_mode == 0x66) {
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      J->prev_pt = (GCproto *)0x0;
      lj_snap_add(J);
    }
    lj_record_ret(J,rbase,uVar22 - 1);
    break;
  case IR_SNEW:
    LVar15 = rec_for(J,pc,0);
    if (LVar15 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case IR_XSNEW:
    LVar15 = rec_for(J,pc,0);
    if (LVar15 != LOOPEV_LEAVE) {
      lj_record_stop(J,LJ_TRLINK_ROOT,(uint)*(ushort *)((long)pc + uVar22 * 4 + -0x1fffe));
      goto switchD_0014f2e6_caseD_27;
    }
    break;
  case IR_TNEW:
    LVar15 = rec_for(J,pc + (uVar22 - 0x8000),1);
    goto LAB_0014fab8;
  case IR_TDUP:
  case IR_BUFHDR:
  case IR_TBAR:
  case IR_TOBIT:
  case IR_CALLN:
    lj_trace_err(J,LJ_TRERR_BLACKL);
  case IR_CNEW:
    LVar15 = rec_for(J,pc + ((ulong)*(ushort *)((ulong)J->trace[uVar22].gcptr32 + 0x3a) - 0x8000),1)
    ;
    goto LAB_0014fcd7;
  case IR_CNEWI:
    LVar15 = rec_iterl(J,*pc);
LAB_0014fab8:
    rec_loop_interp(J,pc,LVar15);
    goto switchD_0014f2e6_caseD_27;
  case IR_BUFPUT:
    LVar15 = rec_iterl(J,*(BCIns *)((ulong)J->trace[uVar22].gcptr32 + 0x38));
LAB_0014fcd7:
    rec_loop_jit(J,uVar14,LVar15);
    goto switchD_0014f2e6_caseD_27;
  case IR_BUFSTR:
    if (rbase < J->maxslot) {
      J->maxslot = rbase;
    }
    J->pc = J->pc + 1;
    rec_loop_interp(J,pc,LOOPEV_ENTER);
    break;
  case IR_OBAR:
    bVar3 = *(byte *)((ulong)J->trace[uVar22].gcptr32 + 0x38);
    if (rbase < J->maxslot) {
      J->maxslot = rbase;
    }
    J->pc = J->pc + (bVar3 - 0x4d < 0xfffffffc);
    rec_loop_jit(J,uVar14,LOOPEV_ENTER);
    break;
  case IR_XBAR:
    if (rbase < J->maxslot) goto LAB_0014fbd0;
    break;
  case IR_CONV:
    goto LAB_0014f7df;
  case IR_TOSTR:
    rec_func_jit(J,uVar14);
    goto switchD_0014f2e6_caseD_27;
  case IR_STRTO:
    rec_func_vararg(J);
LAB_0014f7df:
    rec_func_setup(J);
    check_call_unroll(J,0);
    goto switchD_0014f2e6_caseD_27;
  case IR_CALLL:
  case IR_CALLS:
    goto switchD_0014f2e6_caseD_5f;
  default:
    if (IVar16 < IR_CALLXS) goto switchD_0014f2e6_caseD_32;
    goto switchD_0014f2e6_caseD_5f;
  }
LAB_0014fd73:
  if (((short)local_34 == 1) && ((TRef)uVar22 != 0)) {
    J->base[uVar24] = (TRef)uVar22;
    if (J->maxslot <= (uint)uVar24) {
      J->maxslot = (uint)uVar24 + 1;
    }
  }
LAB_0014fda1:
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_TRACEOV);
switchD_0014f2e6_caseD_5f:
  lj_ffrecord_func(J);
switchD_0014f2e6_caseD_27:
  goto LAB_0014fd73;
switchD_0014f2e6_caseD_38:
  local_3c = 100;
  goto LAB_0014f666;
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = lj_ir_call(J, IRCALL_lj_tab_len, rc);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    if (rc >= 0xffffff00)
      lj_err_throw(J->L, -(int32_t)rc);  /* Propagate errors. */
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins))));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_ITERN:
  case BC_ISNEXT:
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}